

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int clearDatabasePage(BtShared *pBt,Pgno pgno,int freePageFlag,int *pnChange)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  uint uVar4;
  u8 *puVar5;
  int iVar6;
  ulong uVar7;
  MemPage *pPage;
  MemPage *local_38;
  
  if (pBt->nPage < pgno) {
    sqlite3_log(0xb,"database corruption at line %d of [%.10s]",0xde4a,
                "118a3b35693b134d56ebd780123b7fd6f1497668");
    return 0xb;
  }
  iVar6 = getAndInitPage(pBt,pgno,&local_38,0);
  if (iVar6 != 0) {
    return iVar6;
  }
  uVar3 = local_38->nCell;
  iVar6 = 0;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      uVar3 = local_38->maskPage;
      uVar1 = local_38->aCellIdx[uVar7 * 2];
      uVar2 = local_38->aCellIdx[uVar7 * 2 + 1];
      puVar5 = local_38->aData;
      if (local_38->leaf == '\0') {
        uVar4 = *(uint *)(puVar5 + (CONCAT11(uVar1,uVar2) & uVar3));
        iVar6 = clearDatabasePage(pBt,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                      (uVar4 & 0xff00) << 8 | uVar4 << 0x18,1,pnChange);
        if (iVar6 != 0) goto LAB_00145a9c;
      }
      iVar6 = clearCell(local_38,puVar5 + (CONCAT11(uVar1,uVar2) & uVar3));
      if (iVar6 != 0) goto LAB_00145a9c;
      uVar7 = uVar7 + 1;
      uVar3 = local_38->nCell;
    } while (uVar7 < uVar3);
  }
  if (local_38->leaf == '\0') {
    uVar4 = *(uint *)(local_38->aData + 8);
    iVar6 = clearDatabasePage(pBt,uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                  uVar4 << 0x18,1,pnChange);
    if (iVar6 != 0) goto LAB_00145a9c;
  }
  else if (pnChange != (int *)0x0) {
    *pnChange = *pnChange + (uint)uVar3;
  }
  if (freePageFlag == 0) {
    iVar6 = sqlite3PagerWrite(local_38->pDbPage);
    if (iVar6 == 0) {
      zeroPage(local_38,*local_38->aData | 8);
    }
  }
  else if (iVar6 == 0) {
    iVar6 = freePage2(local_38->pBt,local_38,local_38->pgno);
  }
LAB_00145a9c:
  if (local_38 != (MemPage *)0x0) {
    sqlite3PagerUnref(local_38->pDbPage);
  }
  return iVar6;
}

Assistant:

static int clearDatabasePage(
  BtShared *pBt,           /* The BTree that contains the table */
  Pgno pgno,               /* Page number to clear */
  int freePageFlag,        /* Deallocate page if true */
  int *pnChange            /* Add number of Cells freed to this counter */
){
  MemPage *pPage;
  int rc;
  unsigned char *pCell;
  int i;

  assert( sqlite3_mutex_held(pBt->mutex) );
  if( pgno>btreePagecount(pBt) ){
    return SQLITE_CORRUPT_BKPT;
  }

  rc = getAndInitPage(pBt, pgno, &pPage, 0);
  if( rc ) return rc;
  for(i=0; i<pPage->nCell; i++){
    pCell = findCell(pPage, i);
    if( !pPage->leaf ){
      rc = clearDatabasePage(pBt, get4byte(pCell), 1, pnChange);
      if( rc ) goto cleardatabasepage_out;
    }
    rc = clearCell(pPage, pCell);
    if( rc ) goto cleardatabasepage_out;
  }
  if( !pPage->leaf ){
    rc = clearDatabasePage(pBt, get4byte(&pPage->aData[8]), 1, pnChange);
    if( rc ) goto cleardatabasepage_out;
  }else if( pnChange ){
    assert( pPage->intKey );
    *pnChange += pPage->nCell;
  }
  if( freePageFlag ){
    freePage(pPage, &rc);
  }else if( (rc = sqlite3PagerWrite(pPage->pDbPage))==0 ){
    zeroPage(pPage, pPage->aData[0] | PTF_LEAF);
  }

cleardatabasepage_out:
  releasePage(pPage);
  return rc;
}